

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineRenderToImageTests.cpp
# Opt level: O2

TestStatus *
vkt::pipeline::anon_unknown_0::testAttachmentSize
          (TestStatus *__return_storage_ptr__,Context *context,CaseDef_conflict *caseDef)

{
  VkImageCreateFlags VVar1;
  int iVar2;
  uint uVar3;
  ProgramCollection<vk::ProgramBinary> *pPVar4;
  TestLog *log;
  VkPrimitiveTopology numLayers;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  undefined4 *puVar5;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_00;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_01;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [12];
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  bool bVar14;
  deUint32 queueFamilyIndex;
  int iVar15;
  VkImageAspectFlags VVar16;
  VkResult result;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue queue;
  Allocator *allocator;
  VkPhysicalDeviceProperties *pVVar17;
  ulong uVar18;
  TextureFormat TVar19;
  long lVar20;
  long lVar21;
  ProgramBinary *pPVar22;
  ulong uVar23;
  OutOfMemoryError *this;
  NotSupportedError *this_00;
  deUint32 dVar24;
  uint uVar25;
  VkImageCreateFlags flags;
  long lVar26;
  deUint32 dVar27;
  ulong uVar28;
  size_t sVar29;
  VkPipeline basePipeline;
  long lVar30;
  deUint32 dVar31;
  deUint32 dVar32;
  VkImageType imageType;
  VkImageViewType viewType;
  long lVar33;
  VkPrimitiveTopology VVar34;
  long lVar35;
  long lVar36;
  int iVar37;
  VkPrimitiveTopology VVar38;
  undefined1 useStencil;
  undefined7 uVar39;
  IVec4 imageSize;
  IVec4 checkSize;
  undefined1 local_8b8 [16];
  TextureFormat format;
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> colorBufferAlloc;
  string local_848;
  long local_820;
  VkPhysicalDevice local_818;
  InstanceInterface *local_810;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> vertexBufferAlloc;
  IVec4 checkOffset;
  Move<vk::Handle<(vk::HandleType)9>_> colorImage;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_7c8;
  vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  attachmentHandles;
  VkImageSubresourceRange res_1;
  VkImageSubresourceRange res;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  pipelines;
  Move<vk::Handle<(vk::HandleType)8>_> vertexBuffer;
  Move<vk::Handle<(vk::HandleType)9>_> depthStencilImage;
  RefBase<vk::Handle<(vk::HandleType)17>_> local_6f8;
  Move<vk::Handle<(vk::HandleType)23>_> framebuffer;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  depthStencilAttachments;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  colorAttachments;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> depthStencilImageAlloc;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> colorImageAlloc;
  VkPhysicalDeviceMemoryProperties memoryProperties;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_438;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_418;
  deUint64 local_3f8;
  DeviceInterface *pDStack_3f0;
  VkDevice local_3e8;
  VkAllocationCallbacks *pVStack_3e0;
  RefBase<vk::Handle<(vk::HandleType)16>_> local_3d8;
  deUint64 local_3b8;
  DeviceInterface *pDStack_3b0;
  VkDevice local_3a8;
  VkAllocationCallbacks *pVStack_3a0;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> vertices;
  RefBase<vk::Handle<(vk::HandleType)13>_> local_218;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_1f8;
  RefBase<vk::Handle<(vk::HandleType)13>_> local_1d8;
  VkDeviceSize vertexBufferOffset;
  int local_1b0 [6];
  void *local_198;
  undefined8 local_190;
  undefined8 local_188;
  
  useStencil = SUB81(caseDef,0);
  uVar39 = (undefined7)((ulong)caseDef >> 8);
  checkImageViewTypeRequirements(context,caseDef->viewType);
  vk = Context::getDeviceInterface(context);
  local_810 = Context::getInstanceInterface(context);
  device = Context::getDevice(context);
  local_818 = Context::getPhysicalDevice(context);
  queue = Context::getUniversalQueue(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  allocator = Context::getDefaultAllocator(context);
  iVar2 = *(int *)(CONCAT71(uVar39,useStencil) + 0x18);
  ::vk::getPhysicalDeviceMemoryProperties(&memoryProperties,local_810,local_818);
  uVar23 = 0;
  for (lVar26 = 0; (ulong)memoryProperties.memoryHeapCount << 4 != lVar26; lVar26 = lVar26 + 0x10) {
    if (((*(byte *)((long)&memoryProperties.memoryHeaps[0].flags + lVar26) & 1) != 0) &&
       (uVar28 = *(ulong *)((long)&memoryProperties.memoryHeaps[0].size + lVar26), uVar23 <= uVar28)
       ) {
      uVar23 = uVar28;
    }
  }
  pVVar17 = Context::getDeviceProperties(context);
  if (iVar2 == 0) {
    dVar27 = (pVVar17->limits).maxImageDimension3D;
    dVar24 = (pVVar17->limits).maxImageArrayLayers;
    memoryProperties.memoryTypes[0].heapIndex = dVar27;
  }
  else {
    dVar27 = (pVVar17->limits).maxImageDimension3D;
    dVar24 = (pVVar17->limits).maxImageArrayLayers;
    memoryProperties.memoryTypes[0].heapIndex = dVar27;
    if ((int)dVar24 < (int)dVar27) {
      memoryProperties.memoryTypes[0].heapIndex = dVar24;
    }
  }
  dVar31 = *(deUint32 *)(CONCAT71(uVar39,useStencil) + 4);
  if (dVar31 == 0xffffffff) {
    dVar31 = (pVVar17->limits).maxFramebufferWidth;
  }
  dVar32 = *(deUint32 *)(CONCAT71(uVar39,useStencil) + 8);
  if (dVar32 == 0xffffffff) {
    dVar32 = (pVVar17->limits).maxFramebufferHeight;
  }
  puVar5 = (undefined4 *)CONCAT71(uVar39,useStencil);
  if (puVar5[3] != 0xffffffff) {
    memoryProperties.memoryTypes[0].heapIndex = puVar5[3];
  }
  if (puVar5[4] != 0xffffffff) {
    dVar24 = puVar5[4];
  }
  memoryProperties.memoryTypes[0].propertyFlags = dVar32;
  memoryProperties.memoryTypes[1].propertyFlags = dVar24;
  auVar10 = (undefined1  [12])memoryProperties.memoryTypes._0_12_;
  switch(*puVar5) {
  case 0:
  case 4:
    memoryProperties.memoryTypeCount = (pVVar17->limits).maxImageDimension1D;
    if ((int)dVar31 < (int)memoryProperties.memoryTypeCount) {
      memoryProperties.memoryTypeCount = dVar31;
    }
    memoryProperties._0_16_ = CONCAT124(auVar10,memoryProperties.memoryTypeCount);
    break;
  case 1:
  case 5:
    memoryProperties.memoryTypes[0].propertyFlags = (pVVar17->limits).maxImageDimension2D;
    if ((int)memoryProperties.memoryTypes[0].propertyFlags <= (int)dVar31) {
      dVar31 = memoryProperties.memoryTypes[0].propertyFlags;
    }
    if ((int)dVar32 < (int)memoryProperties.memoryTypes[0].propertyFlags) {
      memoryProperties.memoryTypes[0].propertyFlags = dVar32;
    }
    memoryProperties.memoryTypeCount = dVar31;
    break;
  case 2:
    if ((int)dVar27 <= (int)dVar31) {
      dVar31 = dVar27;
    }
    if ((int)dVar32 < (int)dVar27) {
      dVar27 = dVar32;
    }
    memoryProperties.memoryTypes[0].propertyFlags = dVar27;
    memoryProperties.memoryTypeCount = dVar31;
    break;
  case 3:
  case 6:
    memoryProperties.memoryTypes[0].propertyFlags = (pVVar17->limits).maxImageDimensionCube;
    if ((int)dVar31 < (int)memoryProperties.memoryTypes[0].propertyFlags) {
      memoryProperties.memoryTypes[0].propertyFlags = dVar31;
    }
    memoryProperties.memoryTypeCount = memoryProperties.memoryTypes[0].propertyFlags;
    memoryProperties.memoryTypes[1].propertyFlags = dVar24 - (int)dVar24 % 6;
    break;
  default:
    tcu::Vector<int,_4>::Vector(&imageSize);
    goto LAB_00508173;
  }
  tcu::Vector<int,_4>::Vector(&imageSize,(Vector<int,_4> *)&memoryProperties);
LAB_00508173:
  iVar37 = 0;
  do {
    if (iVar37 == 0) {
      vertices.
      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)context->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream
                ((ostringstream *)
                 &vertices.
                  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      std::operator<<((ostream *)
                      &vertices.
                       super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                      "Using an image with size (width, height, depth, layers) = ");
      tcu::operator<<((ostream *)
                      &vertices.
                       super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&imageSize);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&vertices,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream
                ((ostringstream *)
                 &vertices.
                  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      local_820 = (long)imageSize.m_data[2];
      lVar26 = (long)imageSize.m_data[3];
      numLayers = imageSize.m_data[3];
      if (imageSize.m_data[3] < imageSize.m_data[2]) {
        numLayers = imageSize.m_data[2];
      }
      lVar35 = (long)imageSize.m_data[0];
      lVar30 = (long)imageSize.m_data[1];
      TVar19 = ::vk::mapVkFormat(*(VkFormat *)(CONCAT71(uVar39,useStencil) + 0x14));
      iVar37 = tcu::getPixelSize(TVar19);
      if (iVar2 == 0) {
        lVar20 = 0;
      }
      else {
        lVar20 = (long)imageSize.m_data[0];
        lVar36 = (long)imageSize.m_data[1];
        lVar33 = (long)imageSize.m_data[2];
        lVar21 = (long)imageSize.m_data[3];
        TVar19 = ::vk::mapVkFormat(*(VkFormat *)(CONCAT71(uVar39,useStencil) + 0x18));
        iVar15 = tcu::getPixelSize(TVar19);
        bVar14 = isDepthStencilFormatSupported
                           (local_810,local_818,*(VkFormat *)(CONCAT71(uVar39,useStencil) + 0x18));
        if (!bVar14) {
          this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          tcu::NotSupportedError::NotSupportedError
                    (this_00,"Unsupported depth/stencil format",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineRenderToImageTests.cpp"
                     ,0x340);
          __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
        }
        lVar20 = (long)iVar15 * lVar33 * lVar21 * lVar36 * lVar20;
      }
      if ((ulong)(lVar35 * lVar30 * lVar26 * local_820 * (long)iVar37 + lVar20) <= uVar23 >> 2) {
        local_438.m_data.object.m_internal = 0x2000000020;
        local_438.m_data.deleter.m_deviceIface = (DeviceInterface *)0x800000008;
        tcu::min<int,4>((tcu *)&checkSize,&imageSize,(Vector<int,_4> *)&local_438);
        tcu::operator-((tcu *)&local_6f8,&imageSize,&checkSize);
        tcu::operator/((tcu *)&checkOffset,(Vector<int,_4> *)&local_6f8,2);
        lVar30 = (long)checkSize.m_data[0];
        lVar26 = (long)checkSize.m_data[1];
        lVar20 = (long)checkSize.m_data[2];
        lVar35 = (long)checkSize.m_data[3];
        TVar19 = ::vk::mapVkFormat(*(VkFormat *)(CONCAT71(uVar39,useStencil) + 0x14));
        iVar37 = tcu::getPixelSize(TVar19);
        sVar29 = (long)iVar37 * lVar20 * lVar35 * lVar26 * lVar30;
        makeBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&local_7c8,vk,device,sVar29,2);
        local_418.m_data.deleter.m_device = local_7c8.m_data.deleter.m_device;
        local_418.m_data.deleter.m_allocator = local_7c8.m_data.deleter.m_allocator;
        local_418.m_data.object.m_internal = local_7c8.m_data.object.m_internal;
        local_418.m_data.deleter.m_deviceIface = local_7c8.m_data.deleter.m_deviceIface;
        local_7c8.m_data.object.m_internal = 0;
        local_7c8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
        local_7c8.m_data.deleter.m_device = (VkDevice)0x0;
        local_7c8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_7c8);
        bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&memoryProperties
                   ,vk,device,allocator,(VkBuffer)local_418.m_data.object.m_internal,
                   (MemoryRequirement)0x1);
        colorBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
        m_data.ptr = (Allocation *)memoryProperties._0_8_;
        auVar6._8_8_ = 0;
        auVar6._0_4_ = memoryProperties.memoryTypes[0].heapIndex;
        auVar6._4_4_ = memoryProperties.memoryTypes[1].propertyFlags;
        memoryProperties._0_16_ = auVar6 << 0x40;
        de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                  ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                   &memoryProperties);
        memset((colorBufferAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_hostPtr,0,sVar29);
        ::vk::flushMappedMemoryRange
                  (vk,device,
                   (VkDeviceMemory)
                   ((colorBufferAlloc.
                     super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                    ptr)->m_memory).m_internal,
                   (colorBufferAlloc.
                    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
                   )->m_offset,0xffffffffffffffff);
        pPVar4 = context->m_progCollection;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&vertices,"vert",(allocator<char> *)&vertexBufferOffset);
        pPVar22 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar4,(string *)&vertices);
        ::vk::createShaderModule
                  ((Move<vk::Handle<(vk::HandleType)14>_> *)&memoryProperties,vk,device,pPVar22,0);
        local_7c8.m_data.deleter.m_device = (VkDevice)memoryProperties.memoryTypes._12_8_;
        local_7c8.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)memoryProperties.memoryTypes._20_8_;
        local_7c8.m_data.object.m_internal._0_4_ = memoryProperties.memoryTypeCount;
        local_7c8.m_data.object.m_internal._4_4_ = memoryProperties.memoryTypes[0].propertyFlags;
        local_7c8.m_data.deleter.m_deviceIface =
             (DeviceInterface *)memoryProperties.memoryTypes._4_8_;
        memoryProperties._0_16_ = ZEXT816(0);
        memoryProperties.memoryTypes[1].heapIndex = 0;
        memoryProperties.memoryTypes[2].propertyFlags = 0;
        memoryProperties.memoryTypes[2].heapIndex = 0;
        memoryProperties.memoryTypes[3].propertyFlags = 0;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
                  ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&memoryProperties);
        std::__cxx11::string::~string((string *)&vertices);
        pPVar4 = context->m_progCollection;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&vertices,"frag",(allocator<char> *)&vertexBufferOffset);
        pPVar22 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar4,(string *)&vertices);
        ::vk::createShaderModule
                  ((Move<vk::Handle<(vk::HandleType)14>_> *)&memoryProperties,vk,device,pPVar22,0);
        local_438.m_data.deleter.m_device = (VkDevice)memoryProperties.memoryTypes._12_8_;
        local_438.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)memoryProperties.memoryTypes._20_8_;
        local_438.m_data.object.m_internal._0_4_ = memoryProperties.memoryTypeCount;
        local_438.m_data.object.m_internal._4_4_ = memoryProperties.memoryTypes[0].propertyFlags;
        local_438.m_data.deleter.m_deviceIface =
             (DeviceInterface *)memoryProperties.memoryTypes._4_8_;
        memoryProperties._0_16_ = ZEXT816(0);
        memoryProperties.memoryTypes[1].heapIndex = 0;
        memoryProperties.memoryTypes[2].propertyFlags = 0;
        memoryProperties.memoryTypes[2].heapIndex = 0;
        memoryProperties.memoryTypes[3].propertyFlags = 0;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
                  ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&memoryProperties);
        std::__cxx11::string::~string((string *)&vertices);
        makeRenderPass((Move<vk::Handle<(vk::HandleType)17>_> *)&memoryProperties,vk,device,
                       *(VkFormat *)(CONCAT71(uVar39,useStencil) + 0x14),
                       *(VkFormat *)(CONCAT71(uVar39,useStencil) + 0x18),numLayers,
                       VK_IMAGE_LAYOUT_UNDEFINED,VK_IMAGE_LAYOUT_UNDEFINED);
        local_6f8.m_data.deleter.m_device = (VkDevice)memoryProperties.memoryTypes._12_8_;
        local_6f8.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)memoryProperties.memoryTypes._20_8_;
        local_6f8.m_data.object.m_internal._0_4_ = memoryProperties.memoryTypeCount;
        local_6f8.m_data.object.m_internal._4_4_ = memoryProperties.memoryTypes[0].propertyFlags;
        local_6f8.m_data.deleter.m_deviceIface =
             (DeviceInterface *)memoryProperties.memoryTypes._4_8_;
        memoryProperties._0_16_ = ZEXT816(0);
        memoryProperties.memoryTypes[1].heapIndex = 0;
        memoryProperties.memoryTypes[2].propertyFlags = 0;
        memoryProperties.memoryTypes[2].heapIndex = 0;
        memoryProperties.memoryTypes[3].propertyFlags = 0;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase
                  ((RefBase<vk::Handle<(vk::HandleType)17>_> *)&memoryProperties);
        makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&memoryProperties,vk,device);
        local_3d8.m_data.deleter.m_device = (VkDevice)memoryProperties.memoryTypes._12_8_;
        local_3d8.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)memoryProperties.memoryTypes._20_8_;
        local_3d8.m_data.object.m_internal._0_4_ = memoryProperties.memoryTypeCount;
        local_3d8.m_data.object.m_internal._4_4_ = memoryProperties.memoryTypes[0].propertyFlags;
        local_3d8.m_data.deleter.m_deviceIface =
             (DeviceInterface *)memoryProperties.memoryTypes._4_8_;
        memoryProperties._0_16_ = ZEXT816(0);
        memoryProperties.memoryTypes[1].heapIndex = 0;
        memoryProperties.memoryTypes[2].propertyFlags = 0;
        memoryProperties.memoryTypes[2].heapIndex = 0;
        memoryProperties.memoryTypes[3].propertyFlags = 0;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
                  ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&memoryProperties);
        pipelines.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pipelines.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        pipelines.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        colorImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
        .ptr = (Allocation *)0x0;
        colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
             (VkDevice)0x0;
        colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)0x0;
        colorAttachments.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
        colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)0x0;
        colorAttachments.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        colorAttachments.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
             (VkDevice)0x0;
        depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)0x0;
        depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0
        ;
        depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface
             = (DeviceInterface *)0x0;
        depthStencilImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
        .m_data.ptr = (Allocation *)0x0;
        depthStencilAttachments.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        depthStencilAttachments.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        depthStencilAttachments.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        attachmentHandles.
        super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        attachmentHandles.
        super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        attachmentHandles.
        super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
             (VkDevice)0x0;
        vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)0x0;
        vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
        vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)0x0;
        vertexBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
        m_data.ptr = (Allocation *)0x0;
        framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
             (VkDevice)0x0;
        framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)0x0;
        framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal = 0;
        framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)0x0;
        uVar23 = (ulong)*(uint *)CONCAT71(uVar39,useStencil);
        flags = (uint)(uVar23 == 2) * 0x20;
        VVar1 = flags + 0x10;
        if (uVar23 == 6) {
          flags = VVar1;
        }
        if (uVar23 == 3) {
          flags = VVar1;
        }
        imageType = VK_IMAGE_TYPE_LAST;
        if (uVar23 < 7) {
          imageType = *(VkImageType *)(&DAT_0095d87c + uVar23 * 4);
        }
        vertices.
        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)imageSize.m_data._0_8_;
        vertices.
        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             (pointer)CONCAT44(vertices.
                               super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                               ._M_impl.super__Vector_impl_data._M_finish._4_4_,imageSize.m_data[2])
        ;
        makeImage((Move<vk::Handle<(vk::HandleType)9>_> *)&memoryProperties,vk,device,flags,
                  imageType,*(VkFormat *)(CONCAT71(uVar39,useStencil) + 0x14),(IVec3 *)&vertices,1,
                  imageSize.m_data[3],0x11);
        local_3e8 = (VkDevice)memoryProperties.memoryTypes._12_8_;
        pVStack_3e0 = (VkAllocationCallbacks *)memoryProperties.memoryTypes._20_8_;
        local_3f8._0_4_ = memoryProperties.memoryTypeCount;
        local_3f8._4_4_ = memoryProperties.memoryTypes[0].propertyFlags;
        pDStack_3f0 = (DeviceInterface *)memoryProperties.memoryTypes._4_8_;
        memoryProperties._0_16_ = ZEXT816(0);
        memoryProperties.memoryTypes[1].heapIndex = 0;
        memoryProperties.memoryTypes[2].propertyFlags = 0;
        memoryProperties.memoryTypes[2].heapIndex = 0;
        memoryProperties.memoryTypes[3].propertyFlags = 0;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::reset
                  (&colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>);
        colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device = local_3e8
        ;
        colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
             pVStack_3e0;
        colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal =
             local_3f8;
        colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
             pDStack_3f0;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
                  ((RefBase<vk::Handle<(vk::HandleType)9>_> *)&memoryProperties);
        bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&memoryProperties,
                  vk,device,allocator,
                  (VkImage)colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                           m_internal,(MemoryRequirement)0x0);
        auVar7._8_8_ = 0;
        auVar7._0_4_ = memoryProperties.memoryTypes[0].heapIndex;
        auVar7._4_4_ = memoryProperties.memoryTypes[1].propertyFlags;
        memoryProperties._0_16_ = auVar7 << 0x40;
        data.ptr._1_7_ = uVar39;
        data.ptr._0_1_ = useStencil;
        data._8_8_ = context;
        de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
                  (&colorImageAlloc.
                    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>,data);
        de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                  ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                   &memoryProperties);
        if (iVar2 != 0) {
          vertices.
          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)imageSize.m_data._0_8_;
          vertices.
          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)CONCAT44(vertices.
                                 super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._4_4_,1);
          makeImage((Move<vk::Handle<(vk::HandleType)9>_> *)&memoryProperties,vk,device,0,
                    VK_IMAGE_TYPE_2D,*(VkFormat *)(CONCAT71(uVar39,useStencil) + 0x18),
                    (IVec3 *)&vertices,1,numLayers,0x20);
          local_3a8 = (VkDevice)memoryProperties.memoryTypes._12_8_;
          pVStack_3a0 = (VkAllocationCallbacks *)memoryProperties.memoryTypes._20_8_;
          local_3b8._0_4_ = memoryProperties.memoryTypeCount;
          local_3b8._4_4_ = memoryProperties.memoryTypes[0].propertyFlags;
          pDStack_3b0 = (DeviceInterface *)memoryProperties.memoryTypes._4_8_;
          memoryProperties._0_16_ = ZEXT816(0);
          memoryProperties.memoryTypes[1].heapIndex = 0;
          memoryProperties.memoryTypes[2].propertyFlags = 0;
          memoryProperties.memoryTypes[2].heapIndex = 0;
          memoryProperties.memoryTypes[3].propertyFlags = 0;
          ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::reset
                    (&depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>);
          depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
               local_3a8;
          depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator
               = pVStack_3a0;
          depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal =
               local_3b8;
          depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
          m_deviceIface = pDStack_3b0;
          ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
                    ((RefBase<vk::Handle<(vk::HandleType)9>_> *)&memoryProperties);
          bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                    &memoryProperties,vk,device,allocator,
                    (VkImage)depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                             object.m_internal,(MemoryRequirement)0x0);
          auVar8._8_8_ = 0;
          auVar8._0_4_ = memoryProperties.memoryTypes[0].heapIndex;
          auVar8._4_4_ = memoryProperties.memoryTypes[1].propertyFlags;
          memoryProperties._0_16_ = auVar8 << 0x40;
          data_00.ptr._1_7_ = uVar39;
          data_00.ptr._0_1_ = useStencil;
          data_00._8_8_ = context;
          de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
                    (&depthStencilImageAlloc.
                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>,data_00)
          ;
          de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                    ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                     &memoryProperties);
        }
        genFullQuadVertices(&vertices,numLayers);
        sVar29 = (long)vertices.
                       super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)vertices.
                       super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        makeBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&memoryProperties,vk,device,sVar29,0x80);
        uVar13 = memoryProperties.memoryTypes._20_8_;
        uVar12 = memoryProperties.memoryTypes._12_8_;
        uVar11 = memoryProperties.memoryTypes._4_8_;
        format.order = memoryProperties.memoryTypeCount;
        format.type = memoryProperties.memoryTypes[0].propertyFlags;
        memoryProperties._0_16_ = ZEXT816(0);
        memoryProperties.memoryTypes[1].heapIndex = 0;
        memoryProperties.memoryTypes[2].propertyFlags = 0;
        memoryProperties.memoryTypes[2].heapIndex = 0;
        memoryProperties.memoryTypes[3].propertyFlags = 0;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset
                  (&vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>);
        vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
             (VkDevice)uVar12;
        vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)uVar13;
        vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal._0_4_ =
             format.order;
        vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal._4_4_ =
             format.type;
        vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)uVar11;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
                  ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&memoryProperties);
        bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&memoryProperties
                   ,vk,device,allocator,
                   (VkBuffer)
                   vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                   m_internal,(MemoryRequirement)0x1);
        auVar9._8_8_ = 0;
        auVar9._0_4_ = memoryProperties.memoryTypes[0].heapIndex;
        auVar9._4_4_ = memoryProperties.memoryTypes[1].propertyFlags;
        memoryProperties._0_16_ = auVar9 << 0x40;
        data_01.ptr._1_7_ = uVar39;
        data_01.ptr._0_1_ = useStencil;
        data_01._8_8_ = context;
        de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
                  (&vertexBufferAlloc.
                    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>,data_01);
        de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                  ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                   &memoryProperties);
        memcpy((vertexBufferAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_hostPtr,
               vertices.
               super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
               ._M_impl.super__Vector_impl_data._M_start,sVar29);
        ::vk::flushMappedMemoryRange
                  (vk,device,
                   (VkDeviceMemory)
                   ((vertexBufferAlloc.
                     super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                    ptr)->m_memory).m_internal,
                   (vertexBufferAlloc.
                    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
                   )->m_offset,sVar29);
        std::_Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
        ~_Vector_base(&vertices.
                       super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                     );
        VVar16 = getFormatAspectFlags(*(VkFormat *)(CONCAT71(uVar39,useStencil) + 0x18));
        basePipeline.m_internal = 0;
        VVar38 = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
        if (0 < (int)numLayers) {
          VVar38 = numLayers;
        }
        for (VVar34 = VK_PRIMITIVE_TOPOLOGY_POINT_LIST; VVar38 != VVar34;
            VVar34 = VVar34 + VK_PRIMITIVE_TOPOLOGY_LINE_LIST) {
          viewType = VK_IMAGE_VIEW_TYPE_LAST;
          if ((ulong)*(uint *)CONCAT71(uVar39,useStencil) < 7) {
            viewType = *(VkImageViewType *)
                        (&DAT_0095d898 + (ulong)*(uint *)CONCAT71(uVar39,useStencil) * 4);
          }
          subresourceRange.levelCount = 1;
          subresourceRange.aspectMask = 1;
          subresourceRange.baseMipLevel = 0;
          subresourceRange.baseArrayLayer = VVar34;
          subresourceRange.layerCount = 1;
          makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&local_1d8,vk,device,
                        (VkImage)colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                                 object.m_internal,viewType,
                        *(VkFormat *)(CONCAT71(uVar39,useStencil) + 0x14),subresourceRange);
          pipeline::(anonymous_namespace)::makeSharedPtr<vk::Handle<(vk::HandleType)13>>
                    ((_anonymous_namespace_ *)&memoryProperties,
                     (Move<vk::Handle<(vk::HandleType)13>_> *)&local_1d8);
          std::
          vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>>
          ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>
                    ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>>
                      *)&colorAttachments,
                     (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
                     &memoryProperties);
          de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::~SharedPtr
                    ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
                     &memoryProperties);
          ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase(&local_1d8);
          std::
          vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
          push_back(&attachmentHandles,
                    (value_type *)
                    colorAttachments.
                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr);
          vertices.
          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)imageSize.m_data._0_8_;
          makeGraphicsPipeline
                    ((Move<vk::Handle<(vk::HandleType)18>_> *)&local_1f8,vk,device,basePipeline,
                     (VkPipelineLayout)local_3d8.m_data.object.m_internal,
                     (VkRenderPass)local_6f8.m_data.object.m_internal,
                     (VkShaderModule)local_7c8.m_data.object.m_internal,
                     (VkShaderModule)local_438.m_data.object.m_internal,(IVec2 *)&vertices,VVar34,
                     (VVar16 & 2) >> 1,3 < VVar16,(bool)useStencil);
          pipeline::(anonymous_namespace)::makeSharedPtr<vk::Handle<(vk::HandleType)18>>
                    ((_anonymous_namespace_ *)&memoryProperties,
                     (Move<vk::Handle<(vk::HandleType)18>_> *)&local_1f8);
          std::
          vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>>
          ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>
                    ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>>
                      *)&pipelines,
                     (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_> *)
                     &memoryProperties);
          de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>::release
                    ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_> *)
                     &memoryProperties);
          ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_1f8);
          basePipeline.m_internal =
               ((pipelines.
                 super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_ptr->
               super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal;
        }
        if (iVar2 != 0) {
          for (VVar34 = VK_PRIMITIVE_TOPOLOGY_POINT_LIST; VVar38 != VVar34;
              VVar34 = VVar34 + VK_PRIMITIVE_TOPOLOGY_LINE_LIST) {
            subresourceRange_00.baseMipLevel = 0;
            subresourceRange_00.aspectMask = VVar16;
            subresourceRange_00.levelCount = 1;
            subresourceRange_00.baseArrayLayer = VVar34;
            subresourceRange_00.layerCount = 1;
            makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&local_218,vk,device,
                          (VkImage)depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                                   m_data.object.m_internal,VK_IMAGE_VIEW_TYPE_2D,
                          *(VkFormat *)(CONCAT71(uVar39,useStencil) + 0x18),subresourceRange_00);
            pipeline::(anonymous_namespace)::makeSharedPtr<vk::Handle<(vk::HandleType)13>>
                      ((_anonymous_namespace_ *)&memoryProperties,
                       (Move<vk::Handle<(vk::HandleType)13>_> *)&local_218);
            std::
            vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>>
            ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>
                      ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>>
                        *)&depthStencilAttachments,
                       (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
                       &memoryProperties);
            de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::~SharedPtr
                      ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
                       &memoryProperties);
            ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase(&local_218);
            std::
            vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
            ::push_back(&attachmentHandles,
                        (value_type *)
                        depthStencilAttachments.
                        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr);
          }
        }
        makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&memoryProperties,vk,device,
                        (VkRenderPass)local_6f8.m_data.object.m_internal,
                        (deUint32)
                        ((ulong)((long)attachmentHandles.
                                       super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)attachmentHandles.
                                      super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3),
                        attachmentHandles.
                        super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,imageSize.m_data[0],
                        imageSize.m_data[1],1);
        local_848.field_2._M_allocated_capacity._0_4_ = memoryProperties.memoryTypes[1].heapIndex;
        local_848.field_2._M_allocated_capacity._4_4_ =
             memoryProperties.memoryTypes[2].propertyFlags;
        local_848.field_2._8_4_ = memoryProperties.memoryTypes[2].heapIndex;
        local_848.field_2._12_4_ = memoryProperties.memoryTypes[3].propertyFlags;
        local_848._M_dataplus._M_p = (pointer)memoryProperties._0_8_;
        local_848._M_string_length._0_4_ = memoryProperties.memoryTypes[0].heapIndex;
        local_848._M_string_length._4_4_ = memoryProperties.memoryTypes[1].propertyFlags;
        memoryProperties._0_16_ = ZEXT816(0);
        memoryProperties.memoryTypes[1].heapIndex = 0;
        memoryProperties.memoryTypes[2].propertyFlags = 0;
        memoryProperties.memoryTypes[2].heapIndex = 0;
        memoryProperties.memoryTypes[3].propertyFlags = 0;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::reset
                  (&framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>);
        framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
             (VkDevice)local_848.field_2._M_allocated_capacity;
        framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)local_848.field_2._8_8_;
        framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
             (deUint64)local_848._M_dataplus._M_p;
        framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)local_848._M_string_length;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
                  ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&memoryProperties);
        ::vk::createCommandPool
                  ((Move<vk::Handle<(vk::HandleType)24>_> *)&memoryProperties,vk,device,2,
                   queueFamilyIndex,(VkAllocationCallbacks *)0x0);
        local_848.field_2._M_allocated_capacity._0_4_ = memoryProperties.memoryTypes[1].heapIndex;
        local_848.field_2._M_allocated_capacity._4_4_ =
             memoryProperties.memoryTypes[2].propertyFlags;
        local_848.field_2._8_4_ = memoryProperties.memoryTypes[2].heapIndex;
        local_848.field_2._12_4_ = memoryProperties.memoryTypes[3].propertyFlags;
        local_848._M_dataplus._M_p = (pointer)memoryProperties._0_8_;
        local_848._M_string_length._0_4_ = memoryProperties.memoryTypes[0].heapIndex;
        local_848._M_string_length._4_4_ = memoryProperties.memoryTypes[1].propertyFlags;
        memoryProperties._0_16_ = ZEXT816(0);
        memoryProperties.memoryTypes[1].heapIndex = 0;
        memoryProperties.memoryTypes[2].propertyFlags = 0;
        memoryProperties.memoryTypes[2].heapIndex = 0;
        memoryProperties.memoryTypes[3].propertyFlags = 0;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
                  ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&memoryProperties);
        makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&memoryProperties,vk,device,
                          (VkCommandPool)local_848._M_dataplus._M_p);
        format.order = memoryProperties.memoryTypeCount;
        format.type = memoryProperties.memoryTypes[0].propertyFlags;
        memoryProperties._0_16_ = ZEXT816(0);
        memoryProperties.memoryTypes[1].heapIndex = 0;
        memoryProperties.memoryTypes[2].propertyFlags = 0;
        memoryProperties.memoryTypes[2].heapIndex = 0;
        memoryProperties.memoryTypes[3].propertyFlags = 0;
        ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
                  ((RefBase<vk::VkCommandBuffer_s_*> *)&memoryProperties);
        beginCommandBuffer(vk,(VkCommandBuffer)format);
        memoryProperties._0_16_ = getClearValue(*(VkFormat *)(CONCAT71(uVar39,useStencil) + 0x14));
        std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::vector
                  ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)&vertices,
                   (long)(int)numLayers,(value_type *)&memoryProperties,
                   (allocator_type *)&vertexBufferOffset);
        if (iVar2 != 0) {
          memoryProperties.memoryTypeCount = 0x3f800000;
          memoryProperties.memoryTypes[0].propertyFlags = 0x2a;
          std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::insert
                    ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)&vertices,
                     (const_iterator)
                     vertices.
                     super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(long)(int)numLayers,
                     (value_type *)&memoryProperties);
        }
        memoryProperties.memoryTypeCount = 0x2b;
        memoryProperties.memoryTypes[0].heapIndex = 0;
        memoryProperties.memoryTypes[1].propertyFlags = 0;
        memoryProperties.memoryTypes[1].heapIndex = (undefined4)local_6f8.m_data.object.m_internal;
        memoryProperties.memoryTypes[2].propertyFlags = local_6f8.m_data.object.m_internal._4_4_;
        memoryProperties.memoryTypes[2].heapIndex =
             (undefined4)
             framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal;
        memoryProperties.memoryTypes[3].propertyFlags =
             framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal.
             _4_4_;
        memoryProperties.memoryTypes[3].heapIndex = 0;
        memoryProperties.memoryTypes[4].propertyFlags = 0;
        memoryProperties.memoryTypes[4].heapIndex = imageSize.m_data[0];
        memoryProperties.memoryTypes[5].propertyFlags = imageSize.m_data[1];
        vertexBufferOffset = 0;
        memoryProperties.memoryTypes[5].heapIndex =
             (deUint32)
             ((ulong)((long)vertices.
                            super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)vertices.
                           super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4);
        memoryProperties.memoryTypes._52_8_ =
             vertices.
             super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (*vk->_vptr_DeviceInterface[0x74])(vk,format,&memoryProperties,0);
        (*vk->_vptr_DeviceInterface[0x58])(vk,format,0,1,&vertexBuffer,&vertexBufferOffset);
        std::_Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::~_Vector_base
                  ((_Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)&vertices);
        for (lVar26 = 0; (ulong)numLayers << 2 != lVar26; lVar26 = lVar26 + 4) {
          if (lVar26 != 0) {
            (*vk->_vptr_DeviceInterface[0x75])(vk,format,0);
          }
          (*vk->_vptr_DeviceInterface[0x4c])
                    (vk,format,0,
                     **(undefined8 **)
                       ((long)&(pipelines.
                                super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar26 * 4));
          (*vk->_vptr_DeviceInterface[0x59])(vk,format,4,1);
        }
        (*vk->_vptr_DeviceInterface[0x76])(vk,format);
        memoryProperties.memoryTypeCount = 0x2d;
        memoryProperties.memoryTypes[0].heapIndex = 0;
        memoryProperties.memoryTypes[1].propertyFlags = 0;
        memoryProperties.memoryTypes[1].heapIndex = 0x100;
        memoryProperties.memoryTypes[2].propertyFlags = 0x800;
        memoryProperties.memoryTypes[2].heapIndex = 2;
        memoryProperties.memoryTypes[3].propertyFlags = 6;
        memoryProperties.memoryTypes[3].heapIndex = 0xffffffff;
        memoryProperties.memoryTypes[4].propertyFlags = 0xffffffff;
        memoryProperties.memoryTypes[4].heapIndex =
             (undefined4)
             colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
        memoryProperties.memoryTypes[5].propertyFlags =
             colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal._4_4_
        ;
        memoryProperties.memoryTypes[5].heapIndex = 1;
        memoryProperties.memoryTypes[6].propertyFlags = 0;
        memoryProperties.memoryTypes[6].heapIndex = 1;
        memoryProperties.memoryTypes[7].propertyFlags = 0;
        memoryProperties.memoryTypes[7].heapIndex = imageSize.m_data[3];
        (*vk->_vptr_DeviceInterface[0x6d])
                  (vk,format,0x400,0x1000,0,0,0,0,0,1,(int)&memoryProperties);
        vertices.
        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        vertices.
        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        vertices.
        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
        (*vk->_vptr_DeviceInterface[99])
                  (vk,format,
                   colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal
                   ,6,local_418.m_data.object.m_internal,1,(int)(TextureLevel *)&vertices);
        vertexBufferOffset = CONCAT44(vertexBufferOffset._4_4_,0x2c);
        local_1b0[0] = 0;
        local_1b0[1] = 0;
        local_1b0[2] = 0x1000;
        local_1b0[3] = 0x2000;
        local_1b0[4] = -1;
        local_1b0[5] = -1;
        local_198 = (void *)local_418.m_data.object.m_internal;
        local_190 = 0;
        local_188 = 0xffffffffffffffff;
        (*vk->_vptr_DeviceInterface[0x6d])
                  (vk,format,0x1000,0x4000,0,0,0,1,(int)&vertexBufferOffset,0,0);
        result = (*vk->_vptr_DeviceInterface[0x4a])(vk,format);
        ::vk::checkResult(result,"vk.endCommandBuffer(*cmdBuffer)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineRenderToImageTests.cpp"
                          ,0x410);
        submitCommandsAndWait(vk,device,queue,(VkCommandBuffer)format);
        ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
                  ((RefBase<vk::VkCommandBuffer_s_*> *)&format);
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
                  ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&local_848);
        ::vk::invalidateMappedMemoryRange
                  (vk,device,
                   (VkDeviceMemory)
                   ((colorBufferAlloc.
                     super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                    ptr)->m_memory).m_internal,
                   (colorBufferAlloc.
                    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
                   )->m_offset,0xffffffffffffffff);
        format = ::vk::mapVkFormat(*(VkFormat *)(CONCAT71(uVar39,useStencil) + 0x14));
        if (checkSize.m_data[3] < checkSize.m_data[2]) {
          checkSize.m_data[3] = checkSize.m_data[2];
        }
        iVar2 = checkOffset.m_data[3];
        if (checkOffset.m_data[3] < checkOffset.m_data[2]) {
          iVar2 = checkOffset.m_data[2];
        }
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)&memoryProperties,&format,checkSize.m_data[0],
                   checkSize.m_data[1],checkSize.m_data[3],
                   (colorBufferAlloc.
                    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
                   )->m_hostPtr);
        tcu::TextureLevel::TextureLevel
                  ((TextureLevel *)&vertices,&format,checkSize.m_data[0],checkSize.m_data[1],
                   checkSize.m_data[3]);
        tcu::TextureLevel::getAccess
                  ((PixelBufferAccess *)&vertexBufferOffset,(TextureLevel *)&vertices);
        generateExpectedImage((PixelBufferAccess *)&vertexBufferOffset,(IVec2 *)&local_848,iVar2);
        bVar14 = ::vk::isFloatFormat(*(VkFormat *)(CONCAT71(uVar39,useStencil) + 0x14));
        log = context->m_testCtx->m_log;
        if (bVar14) {
          tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_848,0.01);
          bVar14 = tcu::floatThresholdCompare
                             (log,"Image Comparison","",
                              (ConstPixelBufferAccess *)&vertexBufferOffset,
                              (ConstPixelBufferAccess *)&memoryProperties,(Vec4 *)&local_848,
                              COMPARE_LOG_RESULT);
        }
        else {
          tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)&local_848,2);
          bVar14 = tcu::intThresholdCompare
                             (log,"Image Comparison","",
                              (ConstPixelBufferAccess *)&vertexBufferOffset,
                              (ConstPixelBufferAccess *)&memoryProperties,(UVec4 *)&local_848,
                              COMPARE_LOG_RESULT);
        }
        if (bVar14 == false) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_848,"Fail",(allocator<char> *)&local_3f8);
          tcu::TestStatus::fail(__return_storage_ptr__,&local_848);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_848,"Pass",(allocator<char> *)&local_3f8);
          tcu::TestStatus::pass(__return_storage_ptr__,&local_848);
        }
        std::__cxx11::string::~string((string *)&local_848);
        tcu::TextureLevel::~TextureLevel((TextureLevel *)&vertices);
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
                  (&framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>);
        de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                  (&vertexBufferAlloc.
                    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
                  (&vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>);
        std::
        _Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
        ::~_Vector_base(&attachmentHandles.
                         super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                       );
        std::
        vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
        ::~vector(&depthStencilAttachments);
        de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                  (&depthStencilImageAlloc.
                    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
                  (&depthStencilImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>);
        std::
        vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
        ::~vector(&colorAttachments);
        de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                  (&colorImageAlloc.
                    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
                  (&colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>);
        std::
        vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
        ::~vector(&pipelines);
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_3d8);
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase(&local_6f8);
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_438);
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
                  ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&local_7c8);
        de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                  (&colorBufferAlloc.
                    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_418);
        return __return_storage_ptr__;
      }
      this = (OutOfMemoryError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&memoryProperties,"Image size exceeds test\'s image memory budget",
                 (allocator<char> *)&vertices);
      ::vk::OutOfMemoryError::OutOfMemoryError
                (this,VK_ERROR_OUT_OF_DEVICE_MEMORY,(string *)&memoryProperties);
      __cxa_throw(this,&::vk::OutOfMemoryError::typeinfo,::vk::OutOfMemoryError::~OutOfMemoryError);
    }
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)local_8b8,&imageSize);
    uVar18 = 0;
    dVar27 = local_8b8._0_4_;
    for (uVar28 = 1; uVar28 != 4; uVar28 = uVar28 + 1) {
      if ((int)dVar27 < (int)*(deUint32 *)(local_8b8 + uVar28 * 4)) {
        uVar18 = uVar28 & 0xffffffff;
        dVar27 = *(deUint32 *)(local_8b8 + uVar28 * 4);
      }
    }
    iVar15 = (int)uVar18;
    uVar3 = *(uint *)(local_8b8 + (long)iVar15 * 4);
    uVar25 = (int)uVar3 >> 1;
    if ((*(int *)CONCAT71(uVar39,useStencil) == 6) || (*(int *)CONCAT71(uVar39,useStencil) == 3)) {
      if (iVar15 < 2) {
        local_8b8._4_4_ = uVar25;
        local_8b8._0_4_ = uVar25;
        goto LAB_0050822f;
      }
      if ((iVar15 != 3) || ((int)uVar25 < 6)) {
        tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&memoryProperties,0);
        auVar6 = (undefined1  [16])memoryProperties._0_16_;
        local_8b8._0_4_ = memoryProperties.memoryTypeCount;
        local_8b8._4_4_ = memoryProperties.memoryTypes[0].propertyFlags;
        local_8b8._8_4_ = memoryProperties.memoryTypes[0].heapIndex;
        local_8b8._12_4_ = memoryProperties.memoryTypes[1].propertyFlags;
        memoryProperties._0_16_ = auVar6;
        goto LAB_0050822f;
      }
      local_8b8._12_4_ = uVar25 - uVar25 % 6;
    }
    else {
      *(uint *)(local_8b8 + (long)iVar15 * 4) = uVar25;
LAB_0050822f:
      if (uVar3 < 2) {
        tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&memoryProperties,0);
        auVar6 = (undefined1  [16])memoryProperties._0_16_;
        local_8b8._0_4_ = memoryProperties.memoryTypeCount;
        local_8b8._4_4_ = memoryProperties.memoryTypes[0].propertyFlags;
        local_8b8._8_4_ = memoryProperties.memoryTypes[0].heapIndex;
        local_8b8._12_4_ = memoryProperties.memoryTypes[1].propertyFlags;
        memoryProperties._0_16_ = auVar6;
      }
    }
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&memoryProperties,(Vector<int,_4> *)local_8b8);
    auVar6 = (undefined1  [16])memoryProperties._0_16_;
    imageSize.m_data[0] = memoryProperties.memoryTypeCount;
    imageSize.m_data[1] = memoryProperties.memoryTypes[0].propertyFlags;
    imageSize.m_data[2] = memoryProperties.memoryTypes[0].heapIndex;
    imageSize.m_data[3] = memoryProperties.memoryTypes[1].propertyFlags;
    memoryProperties._0_16_ = auVar6;
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&memoryProperties);
    bVar14 = tcu::Vector<int,_4>::operator==(&imageSize,(Vector<int,_4> *)&memoryProperties);
    iVar37 = iVar37 + 1;
    if (bVar14) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&memoryProperties,"Couldn\'t create an image with required size",
                 (allocator<char> *)&vertexBufferOffset);
      tcu::TestStatus::fail(__return_storage_ptr__,(string *)&memoryProperties);
      std::__cxx11::string::~string((string *)&memoryProperties);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

tcu::TestStatus testAttachmentSize (Context& context, const CaseDef caseDef)
{
	checkImageViewTypeRequirements(context, caseDef.viewType);

	int sizeReductionIndex = 0;

	for (;;)
	{
		try
		{
			return testWithSizeReduction(context, caseDef, sizeReductionIndex);
		}
		catch (OutOfMemoryError& ex)
		{
			context.getTestContext().getLog()
				<< tcu::TestLog::Message << "-- OutOfMemoryError: " << ex.getMessage() << tcu::TestLog::EndMessage;

			++sizeReductionIndex;
		}
	}
	// Never reached
}